

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<unsigned_short,_false,_false>::DirectSetItemAtRange
          (TypedArray<unsigned_short,_false,_false> *this,int32 start,uint32 length,
          unsigned_short typedValue)

{
  uint uVar1;
  Type puVar2;
  uint uVar3;
  BOOL BVar4;
  uint32 uVar5;
  ulong uVar6;
  BOOL BVar7;
  bool bVar8;
  
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_short,false,false>>(this);
  BVar7 = 0;
  if (BVar4 == 0) {
    if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true)
    {
      JavascriptError::ThrowTypeError
                ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    BVar7 = 1;
    if (start < 0) {
      if ((long)((long)start + (ulong)length) < 0) {
        return 1;
      }
      length = length + start;
      start = 0;
    }
    if ((uint)start < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length)
    {
      uVar5 = UInt32Math::Add(start,length);
      uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
      uVar3 = uVar1 - start;
      if (uVar5 <= uVar1) {
        uVar3 = length;
      }
      uVar6 = (ulong)uVar3;
      puVar2 = (this->super_TypedArrayBase).buffer;
      if (typedValue == 0) {
        memset(puVar2 + (ulong)(uint)start * 2,0,uVar6 * 2);
      }
      else {
        while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
          *(unsigned_short *)(puVar2 + (ulong)(uint)start * 2) = typedValue;
          start = start + 1;
        }
      }
    }
  }
  return BVar7;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }